

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  long *plVar6;
  ostream *poVar7;
  size_t sVar8;
  undefined8 *puVar9;
  undefined8 extraout_RAX;
  long *plVar10;
  ulong *puVar11;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  size_type *psVar13;
  int iVar14;
  ulong uVar15;
  undefined8 uVar16;
  char flag;
  char buffer [256];
  byte local_221;
  string local_220;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  int local_1bc;
  string local_1b8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  long local_190;
  long local_188;
  long lStack_180;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  long *local_158 [2];
  long local_148 [2];
  string local_138 [8];
  
  do {
    sVar4 = read(this->read_fd_,&local_221,1);
    iVar2 = (int)sVar4;
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        this->outcome_ = DIED;
        goto LAB_0013d4ce;
      }
      if (iVar2 == 1) {
        if (local_221 < 0x52) {
          if (local_221 == 0x49) {
            iVar2 = this->read_fd_;
            Message::Message((Message *)&local_198);
            goto LAB_0013d62b;
          }
          if (local_221 == 0x4c) {
            this->outcome_ = LIVED;
            goto LAB_0013d4ce;
          }
        }
        else {
          if (local_221 == 0x54) {
            this->outcome_ = THREW;
            goto LAB_0013d4ce;
          }
          if (local_221 == 0x52) {
            this->outcome_ = RETURNED;
            goto LAB_0013d4ce;
          }
        }
        GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/googletest/googletest/src/gtest-death-test.cc"
                           ,0x1d1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Death test child process reported ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unexpected status byte (",0x18);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        GTestLog::~GTestLog((GTestLog *)local_138);
        goto LAB_0013d4ce;
      }
      break;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1d6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p);
  }
  GTestLog::~GTestLog((GTestLog *)&local_220);
  goto LAB_0013d4ce;
  while( true ) {
    piVar5 = __errno_location();
    iVar14 = *piVar5;
    if (iVar14 != 4) break;
LAB_0013d62b:
    while( true ) {
      sVar4 = read(iVar2,local_138,0xff);
      uVar3 = (uint)sVar4;
      if ((int)uVar3 < 1) break;
      *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar3 & 0x7fffffff)) = 0;
      sVar8 = strlen((char *)local_138);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198.ptr_ + 0x10),(char *)local_138,sVar8);
    }
    if (uVar3 != 0xffffffff) {
      if (uVar3 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/googletest/googletest/src/gtest-death-test.cc"
                           ,0x150);
        StringStreamToString(&local_220,local_198.ptr_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length);
        goto LAB_0013d759;
      }
      piVar5 = __errno_location();
      iVar14 = *piVar5;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/googletest/googletest/src/gtest-death-test.cc"
                     ,0x153);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
  GetLastErrnoDescription_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," [",2);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
LAB_0013d759:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  GTestLog::~GTestLog((GTestLog *)&local_200);
  if (local_198.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_198.ptr_ + 8))(local_198.ptr_);
  }
LAB_0013d4ce:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CHECK failed: File ","");
  plVar6 = (long *)std::__cxx11::string::append((char *)local_158);
  plVar10 = plVar6 + 2;
  local_178 = (long *)*plVar6;
  if (local_178 == plVar10) {
    local_168 = *plVar10;
    lStack_160 = plVar6[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *plVar10;
  }
  local_170 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
  puVar11 = (ulong *)(plVar6 + 2);
  local_1e0 = (ulong *)*plVar6;
  if (local_1e0 == puVar11) {
    local_1d0 = *puVar11;
    lStack_1c8 = plVar6[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *puVar11;
  }
  local_1d8 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1bc = 0x1d9;
  StreamableToString<int>(&local_1b8,&local_1bc);
  uVar15 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar15 = local_1d0;
  }
  if (uVar15 < local_1b8._M_string_length + local_1d8) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      uVar16 = local_1b8.field_2._M_allocated_capacity;
    }
    if (local_1b8._M_string_length + local_1d8 <= (ulong)uVar16) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1e0);
      goto LAB_0013d88e;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_1b8._M_dataplus._M_p);
LAB_0013d88e:
  puVar1 = puVar9 + 2;
  local_200 = (undefined8 *)*puVar9;
  if (local_200 == puVar1) {
    local_1f0 = *puVar1;
    uStack_1e8 = puVar9[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *puVar1;
  }
  local_1f8 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
  pbVar12 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2);
  local_198.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
  if (local_198.ptr_ == pbVar12) {
    local_188 = *(long *)pbVar12;
    lStack_180 = plVar6[3];
    local_198.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_188;
  }
  else {
    local_188 = *(long *)pbVar12;
  }
  local_190 = plVar6[1];
  *plVar6 = (long)pbVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_198);
  psVar13 = (size_type *)(plVar6 + 2);
  local_220._M_dataplus._M_p = (pointer)*plVar6;
  if ((size_type *)local_220._M_dataplus._M_p == psVar13) {
    local_220.field_2._M_allocated_capacity = *psVar13;
    local_220.field_2._8_8_ = plVar6[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar13;
  }
  local_220._M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_220);
  psVar13 = (size_type *)(plVar6 + 2);
  local_138[0]._M_dataplus._M_p = (pointer)*plVar6;
  if ((size_type *)local_138[0]._M_dataplus._M_p == psVar13) {
    local_138[0].field_2._0_8_ = *psVar13;
    local_138[0].field_2._8_8_ = plVar6[3];
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = *psVar13;
  }
  local_138[0]._M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  DeathTestAbort(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  GTestLog::~GTestLog((GTestLog *)&local_200);
  if (local_148 != (long *)0x0) {
    (**(code **)(local_148[0] + 8))(local_148);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}